

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execMulsMusashi<(moira::Core)0,(moira::Instr)81,(moira::Mode)3,2>
          (Moira *this,u16 opcode)

{
  u32 uVar1;
  int iVar2;
  ulong uVar3;
  u32 data;
  u32 ea;
  short local_20 [2];
  u32 local_1c;
  
  uVar3 = (ulong)(opcode >> 9 & 7);
  readOp<(moira::Core)0,(moira::Mode)3,2,0ull>(this,opcode & 7,&local_1c,(u32 *)local_20);
  uVar1 = (this->reg).pc;
  (this->reg).pc0 = uVar1;
  (this->queue).ird = (this->queue).irc;
  uVar1 = read<(moira::Core)0,(moira::AddrSpace)2,2,4ull>(this,uVar1 + 2);
  (this->queue).irc = (u16)uVar1;
  this->readBuffer = (u16)uVar1;
  iVar2 = (int)*(short *)((long)&(this->reg).field_3 + uVar3 * 4) * (int)local_20[0];
  (this->reg).sr.n = SUB41((uint)iVar2 >> 0x1f,0);
  (this->reg).sr.z = iVar2 == 0;
  (this->reg).sr.v = false;
  (this->reg).sr.c = false;
  *(int *)((long)&(this->reg).field_3 + uVar3 * 4) = iVar2;
  return;
}

Assistant:

void
Moira::execMulsMusashi(u16 opcode)
{
    u32 ea, data, result;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    readOp<C, M, Word>(src, &ea, &data);

    prefetch<C, POLL>();
    result = muls<C>(data, readD<Word>(dst));

    if constexpr (I == Instr::MULU) { SYNC_68000(50); SYNC_68010(26); }
    if constexpr (I == Instr::MULS) { SYNC_68000(50); SYNC_68010(28); }

    writeD(dst, result);
}